

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase785::run(TestCase785 *this)

{
  bool bVar1;
  undefined1 auVar2 [8];
  undefined1 auVar3 [8];
  ArrayDisposer *pAVar4;
  undefined4 __fd;
  char *pcVar5;
  ReadableFile *pRVar6;
  String *pSVar7;
  int iVar8;
  InMemoryFileFactory *fileFactory;
  anon_union_4_1_a8c68091_for_NullableValue<int>_2 aVar9;
  None *pNVar10;
  None *pNVar11;
  ArrayPtr<const_kj::StringPtr> parts;
  PathPtr path;
  ArrayPtr<const_kj::StringPtr> parts_00;
  PathPtr path_00;
  StringPtr text;
  Fault f;
  DebugComparison<long_&,_int> _kjCondition;
  Own<const_kj::ReadableFile,_std::nullptr_t> file2;
  Own<const_kj::File,_std::nullptr_t> file;
  Own<kj::Directory,_std::nullptr_t> dir;
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_2;
  ssize_t n;
  TestClock clock;
  undefined1 local_118 [8];
  None *pNStack_110;
  ArrayDisposer *local_108;
  char *local_f0;
  undefined1 local_e8 [8];
  None *pNStack_e0;
  ArrayDisposer *local_d8;
  char *local_d0;
  size_t local_c8;
  char *local_c0;
  size_t local_b8;
  bool local_b0;
  FsNode local_a0;
  ReadableFile *local_98;
  FsNode local_90;
  ReadableFile *local_88;
  undefined8 *local_80;
  String *local_78;
  undefined1 local_70 [8];
  char *local_68;
  char *local_60;
  size_t local_58;
  bool local_50;
  ssize_t local_48;
  Clock local_40;
  undefined8 local_38;
  
  local_40._vptr_Clock = (_func_int **)&PTR_now_006363b8;
  local_38 = 1000000000;
  fileFactory = memfdInMemoryFileFactory();
  newInMemoryDirectory((kj *)&local_80,&local_40,fileFactory);
  pSVar7 = local_78;
  local_e8 = (undefined1  [8])((long)"HTTP/1.1 200 OK\r\nContent-Length: 32\r\n\r\nfoo" + 0x27);
  pNStack_e0 = (None *)&DAT_00000004;
  local_d8 = (ArrayDisposer *)0x4d67ef;
  local_d0 = &DAT_00000004;
  parts.size_ = 2;
  parts.ptr = (StringPtr *)local_e8;
  Path::Path((Path *)local_118,parts);
  path.parts.size_ = (size_t)local_118;
  path.parts.ptr = pSVar7;
  Directory::openFile((Directory *)&local_90,path,(WriteMode)pNStack_110);
  pNVar10 = pNStack_110;
  auVar2 = local_118;
  if ((NullableValue<int>)local_118 != (NullableValue<int>)0x0) {
    local_118[0] = false;
    local_118._1_3_ = 0;
    local_118._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
    pNStack_110 = (None *)0x0;
    (**local_108->_vptr_ArrayDisposer)
              (local_108,auVar2,0x18,pNVar10,pNVar10,ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  (**(local_88->super_FsNode)._vptr_FsNode)(local_e8);
  if ((bool)local_e8[0] != true) {
    local_118 = (undefined1  [8])0x0;
    local_e8[0] = false;
    local_e8._1_3_ = 0;
    local_e8._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
    pNStack_e0 = (None *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)local_118,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)local_118);
  }
  __fd = local_e8._4_4_;
  do {
    local_48 = ::write(__fd,"foo",3);
    if (-1 < local_48) {
      iVar8 = 0;
      break;
    }
    iVar8 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar8 == -1);
  if (iVar8 == 0) {
    local_e8 = (undefined1  [8])&local_48;
    pNStack_e0 = (None *)CONCAT44(pNStack_e0._4_4_,3);
    local_d8 = (ArrayDisposer *)0x4a8289;
    local_d0 = &DAT_00000005;
    local_c8 = CONCAT71(local_c8._1_7_,local_48 == 3);
    if ((local_48 != 3) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[24],kj::_::DebugComparison<long&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x31d,ERROR,"\"failed: expected \" \"n == 3\", _kjCondition",
                 (char (*) [24])"failed: expected n == 3",(DebugComparison<long_&,_int> *)local_e8);
    }
    ReadableFile::readAllText((String *)local_118,local_88);
    pAVar4 = local_108;
    pNVar10 = pNStack_110;
    auVar2 = local_118;
    local_118[0] = false;
    local_118._1_3_ = 0;
    local_118._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
    pNStack_110 = (None *)0x0;
    if (pNVar10 == (None *)&DAT_00000004) {
      iVar8 = bcmp((void *)auVar2,"foo",4);
      local_b0 = iVar8 == 0;
    }
    else {
      local_b0 = false;
    }
    pNVar11 = pNStack_110;
    auVar3 = local_118;
    local_e8 = auVar2;
    pNStack_e0 = pNVar10;
    local_d8 = pAVar4;
    local_d0 = "foo";
    local_c8 = 4;
    local_c0 = " == ";
    local_b8 = 5;
    if ((NullableValue<int>)local_118 != (NullableValue<int>)0x0) {
      local_118[0] = false;
      local_118._1_3_ = 0;
      local_118._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
      pNStack_110 = (None *)0x0;
      (**local_108->_vptr_ArrayDisposer)(local_108,auVar3,1,pNVar11,pNVar11,0);
    }
    if ((local_b0 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::String,kj::StringPtr>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,799,ERROR,
                 "\"failed: expected \" \"file->readAllText() == \\\"foo\\\"_kj\", _kjCondition",
                 (char (*) [49])"failed: expected file->readAllText() == \"foo\"_kj",
                 (DebugComparison<kj::String,_kj::StringPtr> *)local_e8);
    }
    pNVar10 = pNStack_e0;
    auVar2 = local_e8;
    if ((NullableValue<int>)local_e8 != (NullableValue<int>)0x0) {
      local_e8[0] = false;
      local_e8._1_3_ = 0;
      local_e8._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
      pNStack_e0 = (None *)0x0;
      (**local_d8->_vptr_ArrayDisposer)(local_d8,auVar2,1,pNVar10,pNVar10,0);
    }
    pSVar7 = local_78;
    local_e8 = (undefined1  [8])((long)"HTTP/1.1 200 OK\r\nContent-Length: 32\r\n\r\nfoo" + 0x27);
    pNStack_e0 = (None *)&DAT_00000004;
    local_d8 = (ArrayDisposer *)0x4d67ef;
    local_d0 = &DAT_00000004;
    parts_00.size_ = 2;
    parts_00.ptr = (StringPtr *)local_e8;
    Path::Path((Path *)local_118,parts_00);
    aVar9.value = (int)pNStack_110;
    path_00.parts.size_ = (size_t)local_118;
    path_00.parts.ptr = pSVar7;
    ReadableDirectory::openFile((ReadableDirectory *)&local_a0,path_00);
    pNVar10 = pNStack_110;
    auVar2 = local_118;
    if ((NullableValue<int>)local_118 != (NullableValue<int>)0x0) {
      local_118[0] = false;
      local_118._1_3_ = 0;
      local_118._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
      pNStack_110 = (None *)0x0;
      (**local_108->_vptr_ArrayDisposer)
                (local_108,auVar2,0x18,pNVar10,pNVar10,ArrayDisposer::Dispose_<kj::String>::destruct
                );
      aVar9.value = (int)pNVar10;
    }
    ReadableFile::readAllText((String *)local_118,local_98);
    pAVar4 = local_108;
    pNVar10 = pNStack_110;
    auVar2 = local_118;
    local_118[0] = false;
    local_118._1_3_ = 0;
    local_118._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
    pNStack_110 = (None *)0x0;
    if (pNVar10 == (None *)&DAT_00000004) {
      iVar8 = bcmp((void *)auVar2,"foo",4);
      local_b0 = iVar8 == 0;
    }
    else {
      local_b0 = false;
    }
    pNVar11 = pNStack_110;
    auVar3 = local_118;
    local_e8 = auVar2;
    pNStack_e0 = pNVar10;
    local_d8 = pAVar4;
    local_d0 = "foo";
    local_c8 = 4;
    local_c0 = " == ";
    local_b8 = 5;
    if ((NullableValue<int>)local_118 != (NullableValue<int>)0x0) {
      local_118[0] = false;
      local_118._1_3_ = 0;
      local_118._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
      pNStack_110 = (None *)0x0;
      (**local_108->_vptr_ArrayDisposer)(local_108,auVar3,1,pNVar11,pNVar11,0);
      aVar9.value = (int)pNVar11;
    }
    if ((local_b0 == false) && (kj::_::Debug::minSeverity < 3)) {
      aVar9.value = 0x4e4a98;
      kj::_::Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::String,kj::StringPtr>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x323,ERROR,
                 "\"failed: expected \" \"file2->readAllText() == \\\"foo\\\"_kj\", _kjCondition",
                 (char (*) [50])"failed: expected file2->readAllText() == \"foo\"_kj",
                 (DebugComparison<kj::String,_kj::StringPtr> *)local_e8);
    }
    pNVar10 = pNStack_e0;
    auVar2 = local_e8;
    if ((NullableValue<int>)local_e8 != (NullableValue<int>)0x0) {
      local_e8[0] = false;
      local_e8._1_3_ = 0;
      local_e8._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
      pNStack_e0 = (None *)0x0;
      (**local_d8->_vptr_ArrayDisposer)(local_d8,auVar2,1,pNVar10,pNVar10,0);
      aVar9.value = (int)pNVar10;
    }
    text.content.size_ = 4;
    text.content.ptr = "bar";
    File::writeAll((File *)local_88,text);
    ReadableFile::readAllText((String *)local_118,local_98);
    pAVar4 = local_108;
    pNVar10 = pNStack_110;
    auVar2 = local_118;
    local_118 = (undefined1  [8])0x0;
    pNStack_110 = (None *)0x0;
    if (pNVar10 == (None *)&DAT_00000004) {
      iVar8 = bcmp((void *)auVar2,"bar",4);
      local_b0 = iVar8 == 0;
    }
    else {
      local_b0 = false;
    }
    pNVar11 = pNStack_110;
    auVar3 = local_118;
    local_e8 = auVar2;
    pNStack_e0 = pNVar10;
    local_d8 = pAVar4;
    local_d0 = "bar";
    local_c8 = 4;
    local_c0 = " == ";
    local_b8 = 5;
    if (local_118 != (undefined1  [8])0x0) {
      local_118 = (undefined1  [8])0x0;
      pNStack_110 = (None *)0x0;
      (**local_108->_vptr_ArrayDisposer)(local_108,auVar3,1,pNVar11,pNVar11,0);
      aVar9.value = (int)pNVar11;
    }
    if ((local_b0 == false) && (kj::_::Debug::minSeverity < 3)) {
      aVar9.value = 0x4e4b11;
      kj::_::Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::String,kj::StringPtr>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x325,ERROR,
                 "\"failed: expected \" \"file2->readAllText() == \\\"bar\\\"_kj\", _kjCondition",
                 (char (*) [50])"failed: expected file2->readAllText() == \"bar\"_kj",
                 (DebugComparison<kj::String,_kj::StringPtr> *)local_e8);
    }
    pNVar10 = pNStack_e0;
    auVar2 = local_e8;
    if ((NullableValue<int>)local_e8 != (NullableValue<int>)0x0) {
      local_e8[0] = false;
      local_e8._1_3_ = 0;
      local_e8._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
      pNStack_e0 = (None *)0x0;
      (**local_d8->_vptr_ArrayDisposer)(local_d8,auVar2,1,pNVar10,pNVar10,0);
      aVar9.value = (int)pNVar10;
    }
    (**(local_98->super_FsNode)._vptr_FsNode)(local_118);
    bVar1 = (bool)local_118[0];
    if ((bool)local_118[0] == true) {
      aVar9 = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)local_118._4_4_;
      local_118 = (undefined1  [8])((ulong)local_118 & 0xffffffffffffff00);
    }
    local_e8[0] = bVar1;
    if (bVar1 != false) {
      local_e8._4_4_ = aVar9.value;
    }
    pNStack_e0 = (None *)&kj::none;
    local_d8 = (ArrayDisposer *)0x4a80cc;
    local_d0 = &DAT_00000005;
    local_c8 = CONCAT71(local_c8._1_7_,bVar1);
    if ((bVar1 == false) && (kj::_::Debug::minSeverity < 3)) {
      aVar9.value = 0x4e4b8a;
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x326,ERROR,"\"failed: expected \" \"file2->getFd() != kj::none\", _kjCondition",
                 (char (*) [44])"failed: expected file2->getFd() != kj::none",
                 (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)local_e8);
    }
    (*(local_88->super_FsNode)._vptr_FsNode[2])(local_e8);
    pcVar5 = local_c0;
    (*(local_98->super_FsNode)._vptr_FsNode[2])(local_118);
    local_70 = (undefined1  [8])pcVar5;
    local_68 = local_f0;
    local_60 = " == ";
    local_58 = 5;
    local_50 = pcVar5 == local_f0;
    if ((!local_50) && (kj::_::Debug::minSeverity < 3)) {
      aVar9.value = 0x4e4bf5;
      kj::_::Debug::log<char_const(&)[65],kj::_::DebugComparison<unsigned_long,unsigned_long>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x327,ERROR,
                 "\"failed: expected \" \"file->stat().hashCode == file2->stat().hashCode\", _kjCondition"
                 ,(char (*) [65])"failed: expected file->stat().hashCode == file2->stat().hashCode",
                 (DebugComparison<unsigned_long,_unsigned_long> *)local_70);
    }
    (**(code **)((local_78->content).ptr + 0x78))(local_118);
    (*(code *)**(undefined8 **)pNStack_110)(local_70);
    pNVar10 = pNStack_110;
    bVar1 = local_70[0];
    if (local_70[0] == true) {
      aVar9 = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)local_70._4_4_;
      local_70 = (undefined1  [8])((ulong)local_70 & 0xffffffffffffff00);
    }
    local_e8[0] = bVar1;
    if (bVar1 != false) {
      local_e8._4_4_ = aVar9.value;
    }
    pNStack_e0 = (None *)&kj::none;
    local_d8 = (ArrayDisposer *)0x4a80cc;
    local_d0 = &DAT_00000005;
    local_c8 = CONCAT71(local_c8._1_7_,bVar1);
    if (pNStack_110 != (None *)0x0) {
      pNStack_110 = (None *)0x0;
      (**(code **)((Array<char> *)local_118)->ptr)
                (local_118,(long)pNVar10 + *(long *)(*(long *)pNVar10 + -0x10));
    }
    if ((local_c8._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x329,ERROR,
                 "\"failed: expected \" \"dir->createTemporary()->getFd() != kj::none\", _kjCondition"
                 ,(char (*) [61])"failed: expected dir->createTemporary()->getFd() != kj::none",
                 (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)local_e8);
    }
    pRVar6 = local_98;
    if (local_98 != (ReadableFile *)0x0) {
      local_98 = (ReadableFile *)0x0;
      (**(code **)*local_a0._vptr_FsNode)
                (local_a0._vptr_FsNode,
                 (pRVar6->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar6->super_FsNode);
    }
    pRVar6 = local_88;
    if (local_88 != (ReadableFile *)0x0) {
      local_88 = (ReadableFile *)0x0;
      (**(code **)*local_90._vptr_FsNode)
                (local_90._vptr_FsNode,
                 (pRVar6->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar6->super_FsNode);
    }
    pSVar7 = local_78;
    if (local_78 != (String *)0x0) {
      local_78 = (String *)0x0;
      (**(code **)*local_80)
                (local_80,(long)&(pSVar7->content).ptr + *(long *)((pSVar7->content).ptr + -0x10));
    }
    return;
  }
  local_118 = (undefined1  [8])0x0;
  local_e8[0] = false;
  local_e8._1_3_ = 0;
  local_e8._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
  pNStack_e0 = (None *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)local_118,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)local_118);
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }